

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O1

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::icdf
          (result_type_conflict3 *__return_storage_ptr__,snedecor_f_dist<long_double> *this,
          result_type_conflict3 x)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined1 x_00 [16];
  undefined8 in_RAX;
  result_type_conflict3 *prVar3;
  undefined6 in_stack_fffffffffffffff2;
  
  lVar2 = (longdouble)0;
  prVar3 = (result_type_conflict3 *)CONCAT71((int7)((ulong)in_RAX >> 8),lVar2 < x._0_10_);
  lVar1 = (longdouble)1;
  if (lVar2 < x._0_10_ && x._0_10_ < lVar1) {
    if (((x._0_10_ != lVar2) || (NAN(x._0_10_) || NAN(lVar2))) &&
       ((x._0_10_ != lVar1 || (NAN(x._0_10_) || NAN(lVar1))))) {
      x_00._10_6_ = in_stack_fffffffffffffff2;
      x_00._0_10_ = x._0_10_;
      prVar3 = icdf_(__return_storage_ptr__,this,(result_type_conflict3)x_00);
    }
  }
  else {
    prVar3 = (result_type_conflict3 *)__errno_location();
    *(int *)prVar3 = 0x21;
  }
  return prVar3;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }